

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O1

VOID __thiscall
CorUnix::CThreadSuspensionInfo::InitializeSuspensionLock(CThreadSuspensionInfo *this)

{
  uint uVar1;
  
  uVar1 = pthread_mutex_init((pthread_mutex_t *)&this->m_ptmSuspmutex,(pthread_mutexattr_t *)0x0);
  if (uVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","InitializeSuspensionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x30d);
    fprintf(_stderr,"pthread_mutex_init(&suspmutex) returned %d\n",(ulong)uVar1);
    return;
  }
  this->m_fSuspmutexInitialized = 1;
  return;
}

Assistant:

VOID
CThreadSuspensionInfo::InitializeSuspensionLock()
{
#if !DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    int iError = pthread_mutex_init(&m_ptmSuspmutex, NULL);
    if (0 != iError )
    {
        ASSERT("pthread_mutex_init(&suspmutex) returned %d\n", iError);
        return;
    }
    m_fSuspmutexInitialized = TRUE;
#endif // DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
}